

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  int *piVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  FieldDescriptorProto *field;
  DescriptorProto *message_00;
  EnumDescriptorProto *enum_type;
  MessageOptions *options;
  LocationRecorder location;
  LocationRecorder LStack_38;
  
  bVar4 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  bVar5 = true;
  if (!bVar4) {
    iVar6 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar6 == 0) {
      iVar6 = (message->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      LocationRecorder::Init(&LStack_38,message_location);
      LocationRecorder::AddPath(&LStack_38,3);
      LocationRecorder::AddPath(&LStack_38,iVar6);
      iVar6 = (message->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar2 = (message->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar6 < iVar2) {
        ppvVar3 = (message->nested_type_).super_RepeatedPtrFieldBase.elements_;
        (message->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
        message_00 = (DescriptorProto *)ppvVar3[iVar6];
      }
      else {
        iVar6 = (message->nested_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar2 == iVar6) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(message->nested_type_).super_RepeatedPtrFieldBase,iVar6 + 1);
        }
        piVar1 = &(message->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        message_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar3 = (message->nested_type_).super_RepeatedPtrFieldBase.elements_;
        iVar6 = (message->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        (message->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
        ppvVar3[iVar6] = message_00;
      }
      bVar5 = ParseMessageDefinition(this,message_00,&LStack_38);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar6 == 0) {
        iVar6 = (message->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        LocationRecorder::Init(&LStack_38,message_location);
        LocationRecorder::AddPath(&LStack_38,4);
        LocationRecorder::AddPath(&LStack_38,iVar6);
        iVar6 = (message->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        iVar2 = (message->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        if (iVar6 < iVar2) {
          ppvVar3 = (message->enum_type_).super_RepeatedPtrFieldBase.elements_;
          (message->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
          enum_type = (EnumDescriptorProto *)ppvVar3[iVar6];
        }
        else {
          iVar6 = (message->enum_type_).super_RepeatedPtrFieldBase.total_size_;
          if (iVar2 == iVar6) {
            internal::RepeatedPtrFieldBase::Reserve
                      (&(message->enum_type_).super_RepeatedPtrFieldBase,iVar6 + 1);
          }
          piVar1 = &(message->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
          *piVar1 = *piVar1 + 1;
          enum_type = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
          ppvVar3 = (message->enum_type_).super_RepeatedPtrFieldBase.elements_;
          iVar6 = (message->enum_type_).super_RepeatedPtrFieldBase.current_size_;
          (message->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar6 + 1;
          ppvVar3[iVar6] = enum_type;
        }
        bVar5 = ParseEnumDefinition(this,enum_type,&LStack_38);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar6 == 0) {
          LocationRecorder::Init(&LStack_38,message_location);
          LocationRecorder::AddPath(&LStack_38,5);
          bVar5 = ParseExtensions(this,message,&LStack_38);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar6 == 0) {
            LocationRecorder::Init(&LStack_38,message_location);
            LocationRecorder::AddPath(&LStack_38,6);
            bVar5 = ParseExtend(this,&message->extension_,&message->nested_type_,message_location,3,
                                &LStack_38);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar6 == 0) {
              LocationRecorder::Init(&LStack_38,message_location);
              LocationRecorder::AddPath(&LStack_38,7);
              options = DescriptorProto::mutable_options(message);
              bVar5 = ParseOption(this,&options->super_Message,&LStack_38,OPTION_STATEMENT);
            }
            else {
              LocationRecorder::LocationRecorder
                        (&LStack_38,message_location,2,
                         (message->field_).super_RepeatedPtrFieldBase.current_size_);
              field = DescriptorProto::add_field(message);
              bVar5 = ParseMessageField(this,field,&message->nested_type_,message_location,3,
                                        &LStack_38);
            }
          }
        }
      }
    }
    LocationRecorder::~LocationRecorder(&LStack_38);
  }
  return bVar5;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(),
                       message_location,
                       DescriptorProto::kNestedTypeFieldNumber,
                       location);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, OPTION_STATEMENT);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(message->add_field(),
                             message->mutable_nested_type(),
                             message_location,
                             DescriptorProto::kNestedTypeFieldNumber,
                             location);
  }
}